

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::SynthesizableVisitor::visit(SynthesizableVisitor *this,FunctionCallStmt *stmt)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  BuiltinFunctionInfo *pBVar4;
  string local_58;
  undefined1 local_38 [8];
  optional<kratos::BuiltinFunctionInfo> info;
  shared_ptr<kratos::FunctionStmtBlock> *def;
  FunctionCallStmt *stmt_local;
  SynthesizableVisitor *this_local;
  
  def = (shared_ptr<kratos::FunctionStmtBlock> *)stmt;
  stmt_local = (FunctionCallStmt *)this;
  info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
  super__Optional_payload_base<kratos::BuiltinFunctionInfo>._16_8_ = FunctionCallStmt::func(stmt);
  peVar3 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>.
                           _M_payload.super__Optional_payload_base<kratos::BuiltinFunctionInfo>.
                           _16_8_);
  uVar2 = (*(peVar3->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
  if ((uVar2 & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>.
                             _M_payload.super__Optional_payload_base<kratos::BuiltinFunctionInfo>.
                             _16_8_);
    uVar2 = (*(peVar3->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
    if ((uVar2 & 1) != 0) {
      peVar3 = std::
               __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>.
                               _M_payload.super__Optional_payload_base<kratos::BuiltinFunctionInfo>.
                               _16_8_);
      FunctionStmtBlock::function_name_abi_cxx11_(&local_58,peVar3);
      get_builtin_function_info((optional<kratos::BuiltinFunctionInfo> *)local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
      if ((bVar1) &&
         (pBVar4 = std::optional<kratos::BuiltinFunctionInfo>::operator->
                             ((optional<kratos::BuiltinFunctionInfo> *)local_38),
         (pBVar4->synthesizable & 1U) == 0)) {
        std::vector<kratos::IRNode*,std::allocator<kratos::IRNode*>>::
        emplace_back<kratos::FunctionCallStmt*&>
                  ((vector<kratos::IRNode*,std::allocator<kratos::IRNode*>> *)&this->nodes_,
                   (FunctionCallStmt **)&def);
      }
    }
  }
  else {
    std::vector<kratos::IRNode*,std::allocator<kratos::IRNode*>>::
    emplace_back<kratos::FunctionCallStmt*&>
              ((vector<kratos::IRNode*,std::allocator<kratos::IRNode*>> *)&this->nodes_,
               (FunctionCallStmt **)&def);
  }
  return;
}

Assistant:

void visit(FunctionCallStmt* stmt) override {
        auto const& def = stmt->func();
        if (def->is_dpi()) {
            nodes_.emplace_back(stmt);
        } else if (def->is_builtin()) {
            auto info = get_builtin_function_info(def->function_name());
            if (info && !info->synthesizable) {
                nodes_.emplace_back(stmt);
            }
        }
    }